

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O0

void __thiscall async_writer::run(async_writer *this)

{
  const_buffer *pcVar1;
  reference pvVar2;
  vector<char,_std::allocator<char>_> *pvVar3;
  const_buffer *this_00;
  vector<char,_std::allocator<char>_> *this_01;
  int *in_RDI;
  bool bVar4;
  uint i;
  size_type in_stack_ffffffffffffff08;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  size_type in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff38;
  value_type in_stack_ffffffffffffff3f;
  async_writer in_stack_ffffffffffffff70;
  callback local_40 [52];
  uint local_c;
  
  local_c = 0;
  while( true ) {
    this_00 = (const_buffer *)(ulong)local_c;
    pcVar1 = (const_buffer *)
             std::vector<char,_std::allocator<char>_>::size
                       (*(vector<char,_std::allocator<char>_> **)(in_RDI + 4));
    bVar4 = false;
    if (this_00 < pcVar1) {
      bVar4 = *in_RDI + local_c < 100000;
    }
    if (!bVar4) break;
    in_stack_ffffffffffffff3f = (value_type)((ulong)(*in_RDI + local_c) % 100);
    pvVar2 = std::vector<char,_std::allocator<char>_>::at
                       (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    *pvVar2 = in_stack_ffffffffffffff3f;
    local_c = local_c + 1;
  }
  this_01 = (vector<char,_std::allocator<char>_> *)(ulong)local_c;
  pvVar3 = (vector<char,_std::allocator<char>_> *)
           std::vector<char,_std::allocator<char>_>::size
                     (*(vector<char,_std::allocator<char>_> **)(in_RDI + 4));
  if (this_01 < pvVar3) {
    std::vector<char,_std::allocator<char>_>::resize(this_01,in_stack_ffffffffffffff28);
  }
  pcVar1 = *(const_buffer **)(in_RDI + 2);
  booster::aio::buffer(in_stack_ffffffffffffff18);
  booster::aio::const_buffer::const_buffer
            (this_00,(mutable_buffer *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38)
            );
  booster::callback<void_(const_std::error_code_&,_unsigned_long)>::callback<async_writer>
            (*(callback<void_(const_std::error_code_&,_unsigned_long)> **)(in_RDI + 2),
             in_stack_ffffffffffffff70);
  booster::aio::stream_socket::async_write_some(pcVar1,local_40);
  booster::callback<void_(const_std::error_code_&,_unsigned_long)>::~callback
            ((callback<void_(const_std::error_code_&,_unsigned_long)> *)0x1212f7);
  booster::aio::const_buffer::~const_buffer((const_buffer *)0x121304);
  booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x121311);
  return;
}

Assistant:

void run()
	{
		unsigned i;
		for(i=0;i<buf->size() && counter+i < 100000;i++)
			buf->at(i)=char((counter + i) % 100);
		if(i < buf->size())
			buf->resize(i);
		sock->async_write_some(io::buffer(*buf),*this);
	}